

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O3

void __thiscall QFontCache::decreaseCache(QFontCache *this)

{
  EngineCache *this_00;
  QBasicTimer *pQVar1;
  EngineDataCache *this_01;
  _Base_ptr *key;
  Data *pDVar2;
  int *piVar3;
  QFontEngineData *this_02;
  _Rb_tree_node_base *p_Var4;
  Node<QFontEngine_*,_int> *pNVar5;
  _Base_ptr p_Var6;
  QMapData<std::multimap<QFontCache::Key,_QFontCache::Engine,_std::less<QFontCache::Key>,_std::allocator<std::pair<const_QFontCache::Key,_QFontCache::Engine>_>_>_>
  *pQVar7;
  QMapData<std::map<QFontDef,_QFontEngineData_*,_std::less<QFontDef>,_std::allocator<std::pair<const_QFontDef,_QFontEngineData_*>_>_>_>
  *pQVar8;
  const_iterator alast;
  const_iterator afirst;
  iterator afirst_00;
  const_iterator alast_00;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  _Rb_tree_node_base *p_Var13;
  _Base_ptr p_Var14;
  _Rb_tree_header *p_Var15;
  int iVar16;
  ulong uVar17;
  long in_FS_OFFSET;
  QFontEngine *fontEngine;
  uint local_5c;
  _Rb_tree_node_base *local_48;
  QFontEngine *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar8 = (this->engineDataCache).d.d.ptr;
  iVar16 = 0;
  if (pQVar8 == (QMapData<std::map<QFontDef,_QFontEngineData_*,_std::less<QFontDef>,_std::allocator<std::pair<const_QFontDef,_QFontEngineData_*>_>_>_>
                 *)0x0) {
    p_Var4 = (_Rb_tree_node_base *)0x0;
  }
  else {
    p_Var4 = (pQVar8->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  p_Var13 = &(pQVar8->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar8 == (QMapData<std::map<QFontDef,_QFontEngineData_*,_std::less<QFontDef>,_std::allocator<std::pair<const_QFontDef,_QFontEngineData_*>_>_>_>
                 *)0x0) {
    p_Var13 = (_Rb_tree_node_base *)0x0;
  }
  if (p_Var4 != p_Var13) {
    iVar16 = 0;
    do {
      iVar10 = iVar16 + 0x568;
      if ((p_Var4[4]._M_parent)->_M_color == _S_black) {
        iVar10 = iVar16;
      }
      iVar16 = iVar10;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    } while (p_Var4 != p_Var13);
  }
  pQVar7 = (this->engineCache).d.d.ptr;
  if (pQVar7 == (QMapData<std::multimap<QFontCache::Key,_QFontCache::Engine,_std::less<QFontCache::Key>,_std::allocator<std::pair<const_QFontCache::Key,_QFontCache::Engine>_>_>_>
                 *)0x0) {
    p_Var6 = (_Base_ptr)0x0;
  }
  else {
    p_Var6 = (pQVar7->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  this_00 = &this->engineCache;
  p_Var14 = &(pQVar7->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar7 == (QMapData<std::multimap<QFontCache::Key,_QFontCache::Engine,_std::less<QFontCache::Key>,_std::allocator<std::pair<const_QFontCache::Key,_QFontCache::Engine>_>_>_>
                 *)0x0) {
    p_Var14 = (_Base_ptr)0x0;
  }
  if (p_Var6 != p_Var14) {
    do {
      key = &p_Var6[4]._M_left;
      iVar10 = *(int *)((long)&(p_Var6[4]._M_left)->_M_parent + 4);
      pDVar2 = (this->engineCacheCount).d;
      iVar9 = 0;
      if (pDVar2 != (Data *)0x0) {
        pNVar5 = QHashPrivate::Data<QHashPrivate::Node<QFontEngine*,int>>::findNode<QFontEngine*>
                           ((Data<QHashPrivate::Node<QFontEngine*,int>> *)pDVar2,(QFontEngine **)key
                           );
        iVar9 = 0;
        if (pNVar5 != (Node<QFontEngine_*,_int> *)0x0) {
          iVar9 = pNVar5->value;
        }
      }
      if (iVar9 < iVar10) {
        uVar12 = *(uint *)&(*key)[5]._M_parent;
        pDVar2 = (this->engineCacheCount).d;
        uVar17 = 0;
        if ((pDVar2 != (Data *)0x0) &&
           (pNVar5 = QHashPrivate::Data<QHashPrivate::Node<QFontEngine*,int>>::
                     findNode<QFontEngine*>
                               ((Data<QHashPrivate::Node<QFontEngine*,int>> *)pDVar2,
                                (QFontEngine **)key), pNVar5 != (Node<QFontEngine_*,_int> *)0x0)) {
          uVar17 = (ulong)(uint)pNVar5->value;
        }
        iVar16 = iVar16 + (int)(uVar12 / uVar17);
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != p_Var14);
    pQVar7 = (this_00->d).d.ptr;
  }
  iVar10 = 0x200;
  if (pQVar7 != (QMapData<std::multimap<QFontCache::Key,_QFontCache::Engine,_std::less<QFontCache::Key>,_std::allocator<std::pair<const_QFontCache::Key,_QFontCache::Engine>_>_>_>
                 *)0x0) {
    iVar10 = (int)(pQVar7->m)._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x200;
  }
  uVar11 = (uint)(iVar10 + iVar16) >> 10;
  uVar12 = this->max_cost >> 1;
  if (uVar12 <= uVar11) {
    uVar12 = uVar11;
  }
  uVar11 = 0x1000;
  if (0x1000 < uVar12) {
    uVar11 = uVar12;
  }
  if ((this->autoClean == true) && (uVar11 == this->max_cost)) {
    pQVar1 = &this->timer;
    if (this->fast == true) {
      if (pQVar1->m_id != Invalid) {
        QBasicTimer::start(pQVar1,300000000000,1,this);
        this->fast = false;
      }
      goto LAB_00485872;
    }
    QBasicTimer::start(pQVar1,10000000000,1,this);
    this->fast = true;
  }
  this_01 = &this->engineDataCache;
  this->max_cost = uVar11;
  QMap<QFontDef,_QFontEngineData_*>::detach(this_01);
  afirst._M_node =
       (((this->engineDataCache).d.d.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  QMap<QFontDef,_QFontEngineData_*>::detach(this_01);
  pQVar8 = (this->engineDataCache).d.d.ptr;
  while ((_Rb_tree_header *)afirst._M_node != &(pQVar8->m)._M_t._M_impl.super__Rb_tree_header) {
    piVar3 = *(int **)((long)afirst._M_node + 0x88);
    if (*piVar3 == 1) {
      this->total_cost = this->total_cost - 1;
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      this_02 = *(QFontEngineData **)((long)afirst._M_node + 0x88);
      if (this_02 != (QFontEngineData *)0x0) {
        QFontEngineData::~QFontEngineData(this_02);
      }
      operator_delete(this_02,0x568);
      alast.i._M_node = (const_iterator)std::_Rb_tree_increment(afirst._M_node);
      afirst._M_node =
           (_Base_ptr)QMap<QFontDef,_QFontEngineData_*>::erase(this_01,afirst._M_node,alast);
    }
    else {
      afirst._M_node = (_Base_ptr)std::_Rb_tree_increment(afirst._M_node);
    }
    QMap<QFontDef,_QFontEngineData_*>::detach(this_01);
    pQVar8 = (this_01->d).d.ptr;
  }
  do {
    QMultiMap<QFontCache::Key,_QFontCache::Engine>::detach(this_00);
    p_Var6 = (((this_00->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    QMultiMap<QFontCache::Key,_QFontCache::Engine>::detach(this_00);
    p_Var15 = &(((this_00->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var6 == p_Var15) break;
    local_5c = 0xffffffff;
    uVar12 = 0xffffffff;
    local_48 = &p_Var15->_M_header;
    do {
      iVar16 = *(int *)((long)&(p_Var6[4]._M_left)->_M_parent + 4);
      pDVar2 = (this->engineCacheCount).d;
      iVar10 = 0;
      if ((pDVar2 != (Data *)0x0) &&
         (pNVar5 = QHashPrivate::Data<QHashPrivate::Node<QFontEngine*,int>>::findNode<QFontEngine*>
                             ((Data<QHashPrivate::Node<QFontEngine*,int>> *)pDVar2,
                              (QFontEngine **)&p_Var6[4]._M_left),
         pNVar5 != (Node<QFontEngine_*,_int> *)0x0)) {
        iVar10 = pNVar5->value;
      }
      if (((iVar16 == iVar10) && (*(uint *)&p_Var6[4]._M_right < uVar12)) &&
         (uVar11 = *(uint *)((long)&p_Var6[4]._M_right + 4), uVar11 <= local_5c)) {
        uVar12 = *(uint *)&p_Var6[4]._M_right;
        local_5c = uVar11;
        local_48 = p_Var6;
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var15);
    if ((_Rb_tree_header *)local_48 == p_Var15) break;
    local_40 = (QFontEngine *)local_48[4]._M_left;
    QMultiMap<QFontCache::Key,_QFontCache::Engine>::detach(this_00);
    afirst_00._M_node =
         (((this_00->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while (QMultiMap<QFontCache::Key,_QFontCache::Engine>::detach(this_00),
          (_Rb_tree_header *)afirst_00._M_node !=
          &(((this_00->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header) {
      if ((QFontEngine *)afirst_00._M_node[4]._M_left == local_40) {
        LOCK();
        (local_40->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (local_40->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        alast_00.i._M_node = (const_iterator)std::_Rb_tree_increment(afirst_00._M_node);
        afirst_00._M_node =
             (_Base_ptr)
             QMultiMap<QFontCache::Key,_QFontCache::Engine>::erase
                       (this_00,afirst_00._M_node,alast_00);
      }
      else {
        afirst_00._M_node = (_Base_ptr)std::_Rb_tree_increment(afirst_00._M_node);
      }
    }
    uVar11 = local_40->cache_cost + 0x200;
    uVar12 = uVar11 >> 10;
    if (uVar11 < 0x400) {
      uVar12 = 1;
    }
    this->total_cost = this->total_cost - uVar12;
    (*local_40->_vptr_QFontEngine[1])();
    QHash<QFontEngine*,int>::removeImpl<QFontEngine*>
              ((QHash<QFontEngine*,int> *)&this->engineCacheCount,&local_40);
  } while (this->max_cost < this->total_cost);
LAB_00485872:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFontCache::decreaseCache()
{
    // go through the cache and count up everything in use
    uint in_use_cost = 0;

    {
        FC_DEBUG("  SWEEP engine data:");

        // make sure the cost of each engine data is at least 1kb
        const uint engine_data_cost =
            sizeof(QFontEngineData) > 1024 ? sizeof(QFontEngineData) : 1024;

        EngineDataCache::ConstIterator it = engineDataCache.constBegin(),
                                      end = engineDataCache.constEnd();
        for (; it != end; ++it) {
            FC_DEBUG("    %p: ref %2d", it.value(), int(it.value()->ref.loadRelaxed()));

            if (it.value()->ref.loadRelaxed() != 1)
                in_use_cost += engine_data_cost;
        }
    }

    {
        FC_DEBUG("  SWEEP engine:");

        EngineCache::ConstIterator it = engineCache.constBegin(),
                                  end = engineCache.constEnd();
        for (; it != end; ++it) {
            FC_DEBUG("    %p: timestamp %4u hits %2u ref %2d/%2d, cost %u bytes",
                     it.value().data, it.value().timestamp, it.value().hits,
                     it.value().data->ref.loadRelaxed(), engineCacheCount.value(it.value().data),
                     it.value().data->cache_cost);

            if (it.value().data->ref.loadRelaxed() > engineCacheCount.value(it.value().data))
                in_use_cost += it.value().data->cache_cost / engineCacheCount.value(it.value().data);
        }

        // attempt to make up for rounding errors
        in_use_cost += engineCache.size();
    }

    in_use_cost = (in_use_cost + 512) / 1024; // cost is stored in kb

    /*
      calculate the new maximum cost for the cache

      NOTE: in_use_cost is *not* correct due to rounding errors in the
      above algorithm.  instead of worrying about getting the
      calculation correct, we are more interested in speed, and use
      in_use_cost as a floor for new_max_cost
    */
    uint new_max_cost = qMax(qMax(max_cost / 2, in_use_cost), min_cost);

    FC_DEBUG("  after sweep, in use %u kb, total %u kb, max %u kb, new max %u kb",
              in_use_cost, total_cost, max_cost, new_max_cost);

    if (autoClean) {
        if (new_max_cost == max_cost) {
            if (fast) {
                FC_DEBUG("  cannot shrink cache, slowing timer");

                if (timer.isActive()) {
                    timer.start(slow_timeout, this);
                fast = false;
            }

            return;
        } else if (! fast) {
            FC_DEBUG("  dropping into passing gear");

            timer.start(fast_timeout, this);
            fast = true;        }
        }
    }

    max_cost = new_max_cost;

    {
        FC_DEBUG("  CLEAN engine data:");

        // clean out all unused engine data
        EngineDataCache::Iterator it = engineDataCache.begin();
        while (it != engineDataCache.end()) {
            if (it.value()->ref.loadRelaxed() == 1) {
                FC_DEBUG("    %p", it.value());
                decreaseCost(sizeof(QFontEngineData));
                it.value()->ref.deref();
                delete it.value();
                it = engineDataCache.erase(it);
            } else {
                ++it;
            }
        }
    }

    FC_DEBUG("  CLEAN engine:");

    // clean out the engine cache just enough to get below our new max cost
    bool cost_decreased;
    do {
        cost_decreased = false;

        EngineCache::Iterator it = engineCache.begin(),
                             end = engineCache.end();
        // determine the oldest and least popular of the unused engines
        uint oldest = ~0u;
        uint least_popular = ~0u;

        EngineCache::Iterator jt = end;

        for ( ; it != end; ++it) {
            if (it.value().data->ref.loadRelaxed() != engineCacheCount.value(it.value().data))
                continue;

            if (it.value().timestamp < oldest && it.value().hits <= least_popular) {
                oldest = it.value().timestamp;
                least_popular = it.value().hits;
                jt = it;
            }
        }

        it = jt;
        if (it != end) {
            FC_DEBUG("    %p: timestamp %4u hits %2u ref %2d/%2d, type %d",
                     it.value().data, it.value().timestamp, it.value().hits,
                     it.value().data->ref.loadRelaxed(), engineCacheCount.value(it.value().data),
                     it.value().data->type());

            QFontEngine *fontEngine = it.value().data;
            // get rid of all occurrences
            it = engineCache.begin();
            while (it != engineCache.end()) {
                if (it.value().data == fontEngine) {
                    fontEngine->ref.deref();
                    it = engineCache.erase(it);
                } else {
                    ++it;
                }
            }
            // and delete the last occurrence
            Q_ASSERT(fontEngine->ref.loadRelaxed() == 0);
            decreaseCost(fontEngine->cache_cost);
            delete fontEngine;
            engineCacheCount.remove(fontEngine);

            cost_decreased = true;
        }
    } while (cost_decreased && total_cost > max_cost);
}